

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *this)

{
  unsigned_type *puVar1;
  char *pcVar2;
  char cVar3;
  ulong uVar4;
  num_writer f;
  undefined1 auVar5 [16];
  unsigned_type uVar6;
  char cVar7;
  _Alloc_hider _Var8;
  _Alloc_hider _Var9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  string_view prefix;
  undefined1 auVar16 [16];
  string groups;
  string local_88;
  ulong local_68;
  ulong uStack_60;
  int local_58;
  undefined4 uStack_54;
  string *psStack_50;
  char local_48;
  undefined7 uStack_47;
  undefined8 uStack_40;
  
  grouping_impl<char>(&local_88,(locale_ref)(this->writer->locale_).locale_);
  if (local_88._M_string_length == 0) {
    on_dec(this);
  }
  else {
    cVar7 = thousands_sep_impl<char>((locale_ref)(this->writer->locale_).locale_);
    if (cVar7 == '\0') {
      on_dec(this);
    }
    else {
      puVar1 = &this->abs_value;
      uVar6 = *puVar1;
      uVar4 = *(ulong *)((long)&this->abs_value + 8);
      auVar16 = (undefined1  [16])*puVar1;
      auVar5 = (undefined1  [16])*puVar1;
      iVar14 = 1;
      if (((ulong)uVar6 < 10) <= uVar4) {
        iVar15 = 4;
        do {
          iVar14 = iVar15;
          uVar13 = auVar16._8_8_;
          uVar12 = auVar16._0_8_;
          if (uVar13 == 0 && (ulong)(99 < uVar12) <= -uVar13) {
            iVar14 = iVar14 + -2;
            goto LAB_0011ac6c;
          }
          if (uVar13 == 0 && (ulong)(999 < uVar12) <= -uVar13) {
            iVar14 = iVar14 + -1;
            goto LAB_0011ac6c;
          }
          if (uVar13 < (uVar12 < 10000)) goto LAB_0011ac6c;
          auVar16 = __udivti3(uVar12,uVar13,10000,0);
          iVar15 = iVar14 + 4;
        } while (uVar13 != 0 || -uVar13 < (ulong)(99999 < uVar12));
        iVar14 = iVar14 + 1;
      }
LAB_0011ac6c:
      psStack_50 = &local_88;
      pcVar2 = local_88._M_dataplus._M_p + local_88._M_string_length;
      _Var9._M_p = local_88._M_dataplus._M_p;
      iVar15 = iVar14;
      local_58 = iVar14;
      if (local_88._M_string_length != 0) {
        iVar10 = iVar14 + (int)local_88._M_string_length;
        _Var8._M_p = local_88._M_dataplus._M_p;
        do {
          cVar3 = *_Var8._M_p;
          iVar11 = iVar15 - cVar3;
          _Var9._M_p = _Var8._M_p;
          local_58 = iVar14;
          if ((iVar11 == 0 || iVar15 < cVar3) || ((byte)(cVar3 + 0x81U) < 0x82)) break;
          iVar14 = iVar14 + 1;
          _Var8._M_p = _Var8._M_p + 1;
          local_88._M_string_length = local_88._M_string_length - 1;
          _Var9._M_p = pcVar2;
          iVar15 = iVar11;
          local_58 = iVar10;
        } while (local_88._M_string_length != 0);
      }
      if (_Var9._M_p == pcVar2) {
        local_58 = local_58 + (iVar15 + -1) / (int)pcVar2[-1];
      }
      f._20_4_ = uStack_54;
      f.size = local_58;
      f._33_7_ = uStack_47;
      f.sep = cVar7;
      f.abs_value = (unsigned_type)auVar5;
      f.groups = psStack_50;
      f._40_8_ = uStack_40;
      prefix.size_._0_4_ = this->prefix_size;
      prefix.data_ = this->prefix;
      prefix.size_._4_4_ = 0;
      local_68 = (ulong)uVar6;
      uStack_60 = uVar4;
      local_48 = cVar7;
      basic_writer<fmt::v6::buffer_range<char>>::
      write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::num_writer>
                ((basic_writer<fmt::v6::buffer_range<char>> *)this->writer,local_58,prefix,
                 *this->specs,f);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = thousands_sep<char_type>(writer.locale_);
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, sep});
    }